

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O0

Gia_Man_t *
Gia_ManAigSyn2(Gia_Man_t *pInit,int fOldAlgo,int fCoarsen,int fCutMin,int nRelaxRatio,int fDelayMin,
              int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Gia_Man_t *pGVar6;
  int nRelaxRatio_1;
  int fCoarsen_1;
  int fCutMin_1;
  int Delay1;
  int Delay0;
  int Area1;
  int Area0;
  Jf_Par_t *pPars;
  Jf_Par_t Pars;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Man_t *p;
  int fDelayMin_local;
  int nRelaxRatio_local;
  int fCutMin_local;
  int fCoarsen_local;
  int fOldAlgo_local;
  Gia_Man_t *pInit_local;
  
  if (fOldAlgo == 0) {
    Lf_ManSetDefaultPars((Jf_Par_t *)&pPars);
    Pars.nRelaxRatio = 1;
    pPars._4_4_ = 4;
    Pars.nRounds = nRelaxRatio;
    Pars.fUseMux7 = fCoarsen;
  }
  else {
    Jf_ManSetDefaultPars((Jf_Par_t *)&pPars);
  }
  Pars.fPower = fCutMin;
  if (fVerbose != 0) {
    Gia_ManPrintStats(pInit,(Gps_Par_t *)0x0);
  }
  pNew = Gia_ManDup(pInit);
  Gia_ManTransferTiming(pNew,pInit);
  iVar5 = Gia_ManAndNum(pNew);
  iVar3 = Pars.fPower;
  iVar2 = Pars.fUseMux7;
  iVar1 = Pars.nRounds;
  pInit_local = pNew;
  if (iVar5 != 0) {
    if ((fDelayMin != 0) && (pNew->pManTime == (void *)0x0)) {
      Pars.fPower = 0;
      Pars.fUseMux7 = 0;
      Pars.nRounds = 0;
      if (fOldAlgo == 0) {
        Lf_ManPerformMapping(pNew,(Jf_Par_t *)&pPars);
      }
      else {
        Jf_ManPerformMapping(pNew,(Jf_Par_t *)&pPars);
      }
      iVar4 = (int)Pars.Delay;
      iVar5 = Pars.nLutSizeMux;
      pGVar6 = Gia_ManPerformDsdBalance(pNew,6,4,0,0);
      if (fOldAlgo == 0) {
        Lf_ManPerformMapping(pGVar6,(Jf_Par_t *)&pPars);
      }
      else {
        Jf_ManPerformMapping(pGVar6,(Jf_Par_t *)&pPars);
      }
      if ((Pars.nLutSizeMux < iVar5 + -1) ||
         ((Pars.nLutSizeMux == iVar5 + 1 &&
          (((double)((int)Pars.Delay - iVar4) * 100.0) / (double)(int)Pars.Delay < 3.0)))) {
        Gia_ManStop(pNew);
        pNew = pGVar6;
      }
      else {
        Gia_ManStop(pGVar6);
        Vec_IntFreeP(&pNew->vMapping);
      }
    }
    Pars.nRounds = iVar1;
    Pars.fUseMux7 = iVar2;
    Pars.fPower = iVar3;
    pGVar6 = Gia_ManAreaBalance(pNew,0,1000000000,fVeryVerbose,0);
    if (fVerbose != 0) {
      Gia_ManPrintStats(pGVar6,(Gps_Par_t *)0x0);
    }
    Gia_ManStop(pNew);
    Pars.pTimesReq = (float *)pGVar6;
    if (fOldAlgo == 0) {
      pTemp = Lf_ManPerformMapping(pGVar6,(Jf_Par_t *)&pPars);
    }
    else {
      pTemp = Jf_ManPerformMapping(pGVar6,(Jf_Par_t *)&pPars);
    }
    if (fVerbose != 0) {
      Gia_ManPrintStats(pTemp,(Gps_Par_t *)0x0);
    }
    if ((Gia_Man_t *)Pars.pTimesReq != pTemp) {
      Gia_ManStop((Gia_Man_t *)Pars.pTimesReq);
    }
    Pars.pTimesReq = (float *)pTemp;
    pInit_local = Gia_ManAreaBalance(pTemp,0,1000000000,fVeryVerbose,0);
    if (fVerbose != 0) {
      Gia_ManPrintStats(pInit_local,(Gps_Par_t *)0x0);
    }
    Gia_ManStop((Gia_Man_t *)Pars.pTimesReq);
  }
  return pInit_local;
}

Assistant:

Gia_Man_t * Gia_ManAigSyn2( Gia_Man_t * pInit, int fOldAlgo, int fCoarsen, int fCutMin, int nRelaxRatio, int fDelayMin, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * p, * pNew, * pTemp;
    Jf_Par_t Pars, * pPars = &Pars;
    if ( fOldAlgo )
    {
        Jf_ManSetDefaultPars( pPars );
        pPars->fCutMin     = fCutMin;
    }
    else
    {
        Lf_ManSetDefaultPars( pPars );
        pPars->fCutMin     = fCutMin;
        pPars->fCoarsen    = fCoarsen;
        pPars->nRelaxRatio = nRelaxRatio;
        pPars->nAreaTuner  = 1;
        pPars->nCutNum     = 4;
    }
    if ( fVerbose )  Gia_ManPrintStats( pInit, NULL );
    p = Gia_ManDup( pInit );
    Gia_ManTransferTiming( p, pInit );
    if ( Gia_ManAndNum(p) == 0 )
        return p;
    // delay optimization
    if ( fDelayMin && p->pManTime == NULL )
    {
        int Area0, Area1, Delay0, Delay1;
        int fCutMin = pPars->fCutMin;
        int fCoarsen = pPars->fCoarsen;
        int nRelaxRatio = pPars->nRelaxRatio;
        pPars->fCutMin = 0;
        pPars->fCoarsen = 0;
        pPars->nRelaxRatio = 0;
        // perform mapping
        if ( fOldAlgo )
            Jf_ManPerformMapping( p, pPars );
        else
            Lf_ManPerformMapping( p, pPars );
        Area0  = (int)pPars->Area;
        Delay0 = (int)pPars->Delay;
        // perform balancing
        pNew = Gia_ManPerformDsdBalance( p, 6, 4, 0, 0 );
        // perform mapping again
        if ( fOldAlgo )
            Jf_ManPerformMapping( pNew, pPars );
        else
            Lf_ManPerformMapping( pNew, pPars );
        Area1  = (int)pPars->Area;
        Delay1 = (int)pPars->Delay;
        // choose the best result
        if ( Delay1 < Delay0 - 1 || (Delay1 == Delay0 + 1 && 100.0 * (Area1 - Area0) / Area1 < 3.0) )
        {
            Gia_ManStop( p );
            p = pNew;
        }
        else
        {
            Gia_ManStop( pNew );
            Vec_IntFreeP( &p->vMapping );
        }
        // reset params
        pPars->fCutMin = fCutMin;
        pPars->fCoarsen = fCoarsen;
        pPars->nRelaxRatio = nRelaxRatio;
    }
    // perform balancing
    pNew = Gia_ManAreaBalance( p, 0, ABC_INFINITY, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    Gia_ManStop( p );
    // perform mapping
    if ( fOldAlgo )
        pNew = Jf_ManPerformMapping( pTemp = pNew, pPars );
    else
        pNew = Lf_ManPerformMapping( pTemp = pNew, pPars );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    if ( pTemp != pNew )
        Gia_ManStop( pTemp );
    // perform balancing
    pNew = Gia_ManAreaBalance( pTemp = pNew, 0, ABC_INFINITY, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    Gia_ManStop( pTemp );
    return pNew;
}